

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kmip.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Kmip::lookupCredential
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Kmip *this,Path *scope,Path *role)

{
  Client *client;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  Path local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  Url local_68;
  string local_48;
  
  client = *(Client **)this;
  Vault::operator+(&local_48,"scope/",scope);
  std::operator+(&local_a8,&local_48,"/role/");
  Vault::operator+(&local_88,&local_a8,role);
  std::operator+(&local_e8,&local_88,"/credential/lookup");
  local_c8.value_._M_dataplus._M_p = (pointer)&local_c8.value_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p == &local_e8.field_2) {
    local_c8.value_.field_2._8_8_ = local_e8.field_2._8_8_;
  }
  else {
    local_c8.value_._M_dataplus._M_p = local_e8._M_dataplus._M_p;
  }
  local_c8.value_._M_string_length = local_e8._M_string_length;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  getUrl(&local_68,this,&local_c8);
  HttpConsumer::get(__return_storage_ptr__,client,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Kmip::lookupCredential(const Path &scope,
                                                         const Path &role) {
  return HttpConsumer::get(client_, getUrl(Path{"scope/" + scope + "/role/" +
                                                role + "/credential/lookup"}));
}